

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaffeConverter.cpp
# Opt level: O1

void CoreMLConverter::loadCaffeNetwork
               (string *srcPathWeights,NetParameter *caffeSpecWeights,string *srcPathProto,
               NetParameter *caffeSpecProto,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *meanImagePathProto,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_caffe::BlobProto,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_caffe::BlobProto>_>_>
               *meanImageBlobProto)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  CodedInputStream *pCVar4;
  mapped_type *this;
  _Base_ptr p_Var5;
  runtime_error *prVar6;
  ostream *poVar7;
  _Rb_tree_header *p_Var8;
  IstreamInputStream raw_input_mean_image;
  IstreamInputStream raw_input;
  FileInputStream fileInput;
  stringstream msg;
  ifstream iarc;
  string local_6c8;
  string local_6a8;
  string local_688 [32];
  IstreamInputStream local_668;
  IstreamInputStream local_618;
  undefined1 local_5c8 [20];
  bool local_5b4;
  istream local_440 [16];
  ostream local_430 [504];
  istream local_238 [520];
  
  std::ifstream::ifstream(local_238,(string *)srcPathWeights,_S_bin);
  google::protobuf::io::IstreamInputStream::IstreamInputStream(&local_618,local_238,-1);
  pCVar4 = (CodedInputStream *)operator_new(0x50);
  pCVar4->buffer_ = (uint8 *)0x0;
  pCVar4->buffer_end_ = (uint8 *)0x0;
  pCVar4->input_ = &local_618.super_ZeroCopyInputStream;
  pCVar4->total_bytes_read_ = 0;
  pCVar4->overflow_bytes_ = 0;
  *(undefined8 *)((long)&pCVar4->overflow_bytes_ + 2) = 0;
  pCVar4->current_limit_ = 0x7fffffff;
  pCVar4->buffer_size_after_limit_ = 0;
  pCVar4->total_bytes_limit_ = 0x7fffffff;
  iVar3 = google::protobuf::io::CodedInputStream::default_recursion_limit_;
  pCVar4->recursion_budget_ = google::protobuf::io::CodedInputStream::default_recursion_limit_;
  pCVar4->recursion_limit_ = iVar3;
  pCVar4->disable_strict_correctness_enforcement_ = true;
  pCVar4->extension_pool_ = (DescriptorPool *)0x0;
  pCVar4->extension_factory_ = (MessageFactory *)0x0;
  google::protobuf::io::CodedInputStream::Refresh(pCVar4);
  google::protobuf::io::CodedInputStream::SetTotalBytesLimit(pCVar4,0x7fffffff,0x20000000);
  bVar2 = google::protobuf::MessageLite::ParseFromCodedStream
                    ((MessageLite *)caffeSpecWeights,pCVar4);
  if (!bVar2) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_440);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_430,"Unable to load caffe network Weights file: ",0x2b);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_430,(srcPathWeights->_M_dataplus)._M_p,
                        srcPathWeights->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,". ",2);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)local_5c8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar1 = (srcPathWeights->_M_dataplus)._M_p;
  local_6a8._M_dataplus._M_p = (pointer)&local_6a8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_6a8,pcVar1,pcVar1 + srcPathWeights->_M_string_length);
  upgradeCaffeNetworkIfNeeded(&local_6a8,caffeSpecWeights);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6a8._M_dataplus._M_p != &local_6a8.field_2) {
    operator_delete(local_6a8._M_dataplus._M_p,local_6a8.field_2._M_allocated_capacity + 1);
  }
  google::protobuf::io::CodedInputStream::~CodedInputStream(pCVar4);
  operator_delete(pCVar4,0x50);
  if (srcPathProto->_M_string_length != 0) {
    iVar3 = open((srcPathProto->_M_dataplus)._M_p,0);
    google::protobuf::io::FileInputStream::FileInputStream((FileInputStream *)local_5c8,iVar3,-1);
    local_5b4 = true;
    bVar2 = google::protobuf::TextFormat::Parse
                      ((ZeroCopyInputStream *)local_5c8,&caffeSpecProto->super_Message);
    if (!bVar2) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_440);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_430,"Unable to load caffe network Prototxt file: ",0x2c);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_430,(srcPathProto->_M_dataplus)._M_p,srcPathProto->_M_string_length);
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar6,(string *)&local_668);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pcVar1 = (srcPathProto->_M_dataplus)._M_p;
    local_6c8._M_dataplus._M_p = (pointer)&local_6c8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_6c8,pcVar1,pcVar1 + srcPathProto->_M_string_length);
    upgradeCaffeNetworkIfNeeded(&local_6c8,caffeSpecProto);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6c8._M_dataplus._M_p != &local_6c8.field_2) {
      operator_delete(local_6c8._M_dataplus._M_p,local_6c8.field_2._M_allocated_capacity + 1);
    }
    google::protobuf::io::FileInputStream::~FileInputStream((FileInputStream *)local_5c8);
  }
  p_Var5 = (meanImagePathProto->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var8 = &(meanImagePathProto->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var5 != p_Var8) {
    do {
      std::ifstream::ifstream(local_440,(string *)(p_Var5 + 2),_S_bin);
      google::protobuf::io::IstreamInputStream::IstreamInputStream(&local_668,local_440,-1);
      pCVar4 = (CodedInputStream *)operator_new(0x50);
      pCVar4->buffer_ = (uint8 *)0x0;
      pCVar4->buffer_end_ = (uint8 *)0x0;
      pCVar4->input_ = &local_668.super_ZeroCopyInputStream;
      pCVar4->total_bytes_read_ = 0;
      pCVar4->overflow_bytes_ = 0;
      *(undefined8 *)((long)&pCVar4->overflow_bytes_ + 2) = 0;
      pCVar4->current_limit_ = 0x7fffffff;
      pCVar4->buffer_size_after_limit_ = 0;
      pCVar4->total_bytes_limit_ = 0x7fffffff;
      iVar3 = google::protobuf::io::CodedInputStream::default_recursion_limit_;
      pCVar4->recursion_budget_ = google::protobuf::io::CodedInputStream::default_recursion_limit_;
      pCVar4->recursion_limit_ = iVar3;
      pCVar4->disable_strict_correctness_enforcement_ = true;
      pCVar4->extension_pool_ = (DescriptorPool *)0x0;
      pCVar4->extension_factory_ = (MessageFactory *)0x0;
      google::protobuf::io::CodedInputStream::Refresh(pCVar4);
      google::protobuf::io::CodedInputStream::SetTotalBytesLimit(pCVar4,0x7fffffff,0x20000000);
      this = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_caffe::BlobProto,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_caffe::BlobProto>_>_>
             ::operator[](meanImageBlobProto,(key_type *)(p_Var5 + 1));
      bVar2 = google::protobuf::MessageLite::ParseFromCodedStream((MessageLite *)this,pCVar4);
      if (!bVar2) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_5c8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_5c8 + 0x10),
                   "Unable to load caffe network mean image binary proto file: ",0x3b);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_5c8 + 0x10),*(char **)(p_Var5 + 2),(long)p_Var5[2]._M_parent);
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar6,local_688);
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      google::protobuf::io::CodedInputStream::~CodedInputStream(pCVar4);
      operator_delete(pCVar4,0x50);
      google::protobuf::io::IstreamInputStream::~IstreamInputStream(&local_668);
      std::ifstream::~ifstream(local_440);
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var8);
  }
  google::protobuf::io::IstreamInputStream::~IstreamInputStream(&local_618);
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

void CoreMLConverter::loadCaffeNetwork(const std::string& srcPathWeights,
                                      caffe::NetParameter& caffeSpecWeights,
                                      const std::string& srcPathProto,
                                      caffe::NetParameter& caffeSpecProto,
                                      const std::map<std::string, std::string>& meanImagePathProto,
                                      std::map<std::string, caffe::BlobProto>& meanImageBlobProto) {
    
    // Load the Caffemodel weights file
    std::ifstream iarc(srcPathWeights, std::ios::binary);
    google::protobuf::io::IstreamInputStream raw_input(&iarc);
    google::protobuf::io::CodedInputStream* coded_input = new google::protobuf::io::CodedInputStream(&raw_input);
    
    // Load in streams because these network files are going to be large and
    // protobuf default reader fails if messages are larger than 64MB.
    coded_input->SetTotalBytesLimit(kProtoReadBytesLimit, 536870912);
    bool openSuccess = caffeSpecWeights.ParseFromCodedStream(coded_input);
    if (!openSuccess) {
        std::stringstream msg;
        msg << "Unable to load caffe network Weights file: ";
        msg << srcPathWeights << ". ";
        throw std::runtime_error(msg.str());
    }
    CoreMLConverter::upgradeCaffeNetworkIfNeeded(srcPathWeights, caffeSpecWeights);
    delete coded_input;

    // Load the caffe prototxt file if applicable
    if (not srcPathProto.empty()) {
        int fileDescriptor = open(srcPathProto.c_str(), O_RDONLY);
        google::protobuf::io::FileInputStream fileInput(fileDescriptor);
        fileInput.SetCloseOnDelete( true );
        openSuccess = google::protobuf::TextFormat::Parse(&fileInput, &caffeSpecProto);
        if (!openSuccess) {
            std::stringstream msg;
            msg << "Unable to load caffe network Prototxt file: ";
            msg << srcPathProto;
            throw std::runtime_error(msg.str());
        }
        CoreMLConverter::upgradeCaffeNetworkIfNeeded(srcPathProto, caffeSpecProto);
    }
    
    // Load the binary proto file if available
    for (const auto& imageProto : meanImagePathProto) {
        std::ifstream iarc_mean_image(imageProto.second, std::ios::binary);
        google::protobuf::io::IstreamInputStream raw_input_mean_image(&iarc_mean_image);
        coded_input = new google::protobuf::io::CodedInputStream(&raw_input_mean_image);
        coded_input->SetTotalBytesLimit(kProtoReadBytesLimit, 536870912);
        openSuccess = meanImageBlobProto[imageProto.first].ParseFromCodedStream(coded_input);
        if (!openSuccess) {
            std::stringstream msg;
            msg << "Unable to load caffe network mean image binary proto file: ";
            msg << imageProto.second;
            throw std::runtime_error(msg.str());
        }
        delete coded_input;
    }
    
}